

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportError
          (ParserImpl *this,int line,int col,string_view message)

{
  ErrorCollector *pEVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  string_view str;
  string_view v;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view v_00;
  string_view str_04;
  LogMessage LStack_48;
  int local_34;
  
  this->had_errors_ = true;
  pEVar1 = this->error_collector_;
  if (pEVar1 != (ErrorCollector *)0x0) {
    (*pEVar1->_vptr_ErrorCollector[2])
              (pEVar1,(ulong)(uint)line,(ulong)(uint)col,message._M_len,message._M_str);
    return;
  }
  if (line < 0) {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&LStack_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x17e);
    str_03._M_str = "Error parsing text-format ";
    str_03._M_len = 0x1a;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&LStack_48,str_03);
    pcVar2 = (this->root_message_type_->all_names_).payload_;
    v_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v_00._M_str = pcVar2 + ~v_00._M_len;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,v_00);
    str_04._M_str = ": ";
    str_04._M_len = 2;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar3,str_04);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,message);
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&LStack_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x17a);
    str._M_str = "Error parsing text-format ";
    str._M_len = 0x1a;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_48,str)
    ;
    pcVar2 = (this->root_message_type_->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v._M_str = pcVar2 + ~v._M_len;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,v);
    str_00._M_str = ": ";
    str_00._M_len = 2;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar3,str_00);
    local_34 = line + 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(pLVar3,&local_34);
    str_01._M_str = ":";
    str_01._M_len = 1;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar3,str_01);
    local_34 = col + 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(pLVar3,&local_34);
    str_02._M_str = ": ";
    str_02._M_len = 2;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar3,str_02);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,message);
  }
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_48);
  return;
}

Assistant:

void ReportError(int line, int col, absl::string_view message) {
    had_errors_ = true;
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        ABSL_LOG(ERROR) << "Error parsing text-format "
                        << root_message_type_->full_name() << ": " << (line + 1)
                        << ":" << (col + 1) << ": " << message;
      } else {
        ABSL_LOG(ERROR) << "Error parsing text-format "
                        << root_message_type_->full_name() << ": " << message;
      }
    } else {
      error_collector_->RecordError(line, col, message);
    }
  }